

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operands.c
# Opt level: O2

int operands_extract_modrm
              (_CodeInfo *ci,_PrefixState *ps,_DInst *di,_DecodeType effAdrSz,uint mod,uint rm,
              _iflags instFlags,_Operand *op)

{
  byte *pbVar1;
  uint8_t uVar2;
  uint uVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  ulong in_RAX;
  byte bVar8;
  uint8_t uVar9;
  _DecodeType dt;
  _iflags defaultSeg;
  uint8_t *puVar10;
  byte bVar11;
  ulong uVar12;
  ulong uStack_38;
  uchar sib;
  
  uVar12 = (ulong)rm;
  uStack_38 = in_RAX & 0xffffffffffffff;
  uVar3 = ps->usedPrefixes;
  uVar6 = uVar3 | 0x4000;
  ps->usedPrefixes = uVar6;
  if (((instFlags & 0x10) != 0) && ((ps->decodedPrefixes & 0x10) != 0)) {
    uVar6 = uVar3 | 0x4010;
    ps->usedPrefixes = uVar6;
    *(byte *)&di->flags = (byte)di->flags | 1;
  }
  if (effAdrSz == Decode16Bits) {
    if (rm == 6 && mod == 0) {
      op->type = '\x05';
LAB_00105b08:
      di->dispSize = '\x10';
      iVar7 = read_stream_safe_sint16(ci,(int64_t *)&di->disp);
LAB_00105b18:
      if (iVar7 == 0) {
        return 0;
      }
    }
    else {
      if (rm < 4) {
        bVar5 = "##%%&\'%#"[uVar12];
        di->base = bVar5;
        di->usedRegistersMask = di->usedRegistersMask | _REGISTERTORCLASS[bVar5];
        puVar10 = "&\'&\'";
        uVar9 = '\a';
      }
      else {
        puVar10 = "##%%&\'%#";
        uVar9 = '\x06';
      }
      uVar2 = puVar10[uVar12];
      op->type = uVar9;
      op->index = uVar2;
      if (mod == 2) goto LAB_00105b08;
      if (mod == 1) {
        di->dispSize = '\b';
        iVar7 = read_stream_safe_sint8(ci,(int64_t *)&di->disp);
        goto LAB_00105b18;
      }
    }
    dt = ci->dt;
    if (((rm & 0xfffffffe) == 2) || (mod != 0 && rm == 6)) {
LAB_00105c62:
      defaultSeg = 0x100;
      goto LAB_00105c67;
    }
  }
  else if (rm == 5 && mod == 0) {
    di->dispSize = ' ';
    iVar7 = read_stream_safe_sint32(ci,(int64_t *)&di->disp);
    if (iVar7 == 0) {
      return 0;
    }
    op->type = '\x05';
    dt = ci->dt;
    if (dt == Decode64Bits) {
      op->type = '\x06';
      op->index = 'J';
      *(byte *)&di->flags = (byte)di->flags | 0x80;
    }
  }
  else {
    if (rm == 4) {
      iVar7 = read_stream_safe_uint8(ci,&sib);
      if (iVar7 == 0) {
        return 0;
      }
      uVar3 = ps->vrex;
      bVar8 = sib >> 3 & 7;
      if ((uVar3 & 2) == 0) {
        if (bVar8 != 4) goto LAB_00105b5b;
        op->type = '\x06';
        puVar10 = &op->index;
        bVar8 = 4;
        bVar4 = true;
      }
      else {
        pbVar1 = (byte *)((long)&ps->usedPrefixes + 3);
        *pbVar1 = *pbVar1 | 2;
        bVar8 = bVar8 | 8;
LAB_00105b5b:
        op->type = '\a';
        puVar10 = &di->base;
        bVar4 = false;
      }
      bVar5 = sib;
      if ((sib & 7) != 5) {
        if ((uVar3 & 1) != 0) {
          pbVar1 = (byte *)((long)&ps->usedPrefixes + 3);
          *pbVar1 = *pbVar1 | 2;
        }
        bVar11 = sib & 7 | (effAdrSz != Decode64Bits) * '\x10' + (char)(uVar3 & 1) * '\b';
LAB_00105bb5:
        *puVar10 = bVar11;
        if (di->base != 0xff) {
          di->usedRegistersMask = di->usedRegistersMask | _REGISTERTORCLASS[di->base];
        }
        if (!bVar4) {
LAB_00105bd5:
          bVar11 = bVar8 + 0x10;
          if (effAdrSz == Decode64Bits) {
            bVar11 = bVar8;
          }
          uVar9 = '\x01' << (sib >> 6);
          op->index = bVar11;
          if (sib < 0x40) {
            uVar9 = '\0';
          }
          di->scale = uVar9;
        }
        goto LAB_00105c00;
      }
      if (mod != 0) {
        if ((uVar3 & 1) != 0) {
          pbVar1 = (byte *)((long)&ps->usedPrefixes + 3);
          *pbVar1 = *pbVar1 | 2;
        }
        bVar11 = (effAdrSz != Decode64Bits) << 4 | (char)(uVar3 & 1) << 3 | 5;
        goto LAB_00105bb5;
      }
      if (!bVar4) goto LAB_00105bd5;
      op->type = '\x05';
LAB_00105c25:
      di->dispSize = ' ';
      iVar7 = read_stream_safe_sint32(ci,(int64_t *)&di->disp);
LAB_00105c38:
      if (iVar7 == 0) {
        return 0;
      }
    }
    else {
      op->type = '\x06';
      if ((ps->vrex & 1) != 0) {
        ps->usedPrefixes = uVar6 | 0x2000000;
        uVar12 = (ulong)(rm + 8);
      }
      uVar9 = (uint8_t)uVar12;
      if (effAdrSz != Decode64Bits) {
        uVar9 = uVar9 + '\x10';
      }
      op->index = uVar9;
      bVar5 = 0;
LAB_00105c00:
      if (mod == 2) goto LAB_00105c25;
      if (mod == 1) {
        di->dispSize = '\b';
        iVar7 = read_stream_safe_sint8(ci,(int64_t *)&di->disp);
        goto LAB_00105c38;
      }
      if ((bVar5 & 7) == 5) goto LAB_00105c25;
    }
    bVar5 = di->base;
    if ((bVar5 == 0xff) && (bVar5 = op->index, 1 < di->scale)) {
      bVar5 = 0;
    }
    dt = ci->dt;
    if ((bVar5 & 0xfe) == 0x14) goto LAB_00105c62;
  }
  defaultSeg = 0x200;
LAB_00105c67:
  prefixes_use_segment(defaultSeg,ps,dt,di);
  return 1;
}

Assistant:

static int operands_extract_modrm(_CodeInfo* ci, _PrefixState* ps, _DInst* di,
                                  _DecodeType effAdrSz, unsigned int mod, unsigned int rm,
                                  _iflags instFlags, _Operand* op)
{
	unsigned char sib = 0, base = 0;

	/* Memory indirection decoding ahead:) */

	ps->usedPrefixes |= INST_PRE_ADDR_SIZE;
	if ((instFlags & INST_PRE_LOCK) && (ps->decodedPrefixes & INST_PRE_LOCK)) {
		ps->usedPrefixes |= INST_PRE_LOCK;
		di->flags |= FLAG_LOCK;
	}

	if (effAdrSz != Decode16Bits) { /* Decode32Bits or Decode64Bits! */
		/* Remember that from a 32/64 bits ModR/M byte a SIB byte could follow! */
		if ((rm == 5) && (mod == 0)) {
			/* 5 is a special case - only 32 bits displacement, or RIP relative. */
			di->dispSize = 32;
			if (!read_stream_safe_sint32(ci, (int64_t*)&di->disp)) return FALSE;

			/* Absolute address: */
			op->type = O_DISP;

			if (ci->dt == Decode64Bits) {
				/* In 64 bits decoding mode depsite of the address size, a RIP-relative address it is. */
				op->type = O_SMEM;
				op->index = R_RIP;
				di->flags |= FLAG_RIP_RELATIVE;
			}

			prefixes_use_segment(INST_PRE_DS, ps, ci->dt, di);
		}
		else {
			if (rm == 4) {
				/* 4 is a special case - SIB byte + disp8/32 follows! */
				/* Read SIB byte. */
				if (!read_stream_safe_uint8(ci, &sib)) return FALSE;
				operands_extract_sib(di, ps, effAdrSz, sib, mod, op);
			}
			else {
				op->type = O_SMEM;
				if (ps->vrex & PREFIX_EX_B) {
					ps->usedPrefixes |= INST_PRE_REX;
					rm += EX_GPR_BASE;
				}

				if (effAdrSz == Decode64Bits) op->index = (uint8_t)(REGS64_BASE + rm);
				else op->index = (uint8_t)(REGS32_BASE + rm);
			}

			if (mod == 1) {
				di->dispSize = 8;
				if (!read_stream_safe_sint8(ci, (int64_t*)&di->disp)) return FALSE;
			}
			else if ((mod == 2) || ((sib & 7) == 5)) { /* If there is no BASE, read DISP32! */
				di->dispSize = 32;
				if (!read_stream_safe_sint32(ci, (int64_t*)&di->disp)) return FALSE;
			}

			/* Get the base register. */
			base = op->index;
			if (di->base != R_NONE) base = di->base;
			else if (di->scale >= 2) base = 0; /* If it's only an index but got scale, it's still DS. */
			/* Default for EBP/ESP is SS segment. 64 bits mode ignores DS anyway. */
			if ((base == R_EBP) || (base == R_ESP)) prefixes_use_segment(INST_PRE_SS, ps, ci->dt, di);
			else prefixes_use_segment(INST_PRE_DS, ps, ci->dt, di);
		}
	}
	else { /* Decode16Bits */
		/* Decoding according to Table 2-1. (16 bits) */
		if ((mod == 0) && (rm == 6)) {
			/* 6 is a special case - only 16 bits displacement. */
			op->type = O_DISP;
			di->dispSize = 16;
			if (!read_stream_safe_sint16(ci, (int64_t*)&di->disp)) return FALSE;
		}
		else {
			/*
			 * Create the O_MEM for 16 bits indirection that requires 2 registers, E.G: [BS+SI].
			 * or create O_SMEM for a single register indirection, E.G: [BP].
			 */
			static uint8_t MODS[] = { R_BX, R_BX, R_BP, R_BP, R_SI, R_DI, R_BP, R_BX };
			static uint8_t MODS2[] = { R_SI, R_DI, R_SI, R_DI };
			if (rm < 4) {
				op->type = O_MEM;
				di->base = MODS[rm];
				di->usedRegistersMask |= _REGISTERTORCLASS[MODS[rm]];
				op->index = MODS2[rm];
			}
			else {
				op->type = O_SMEM;
				op->index = MODS[rm];
			}

			if (mod == 1) { /* 8 bits displacement + indirection */
				di->dispSize = 8;
				if (!read_stream_safe_sint8(ci, (int64_t*)&di->disp)) return FALSE;
			}
			else if (mod == 2) { /* 16 bits displacement + indirection */
				di->dispSize = 16;
				if (!read_stream_safe_sint16(ci, (int64_t*)&di->disp)) return FALSE;
			}
		}

		if ((rm == 2) || (rm == 3) || ((rm == 6) && (mod != 0))) {
			/* BP's default segment is SS, so ignore it. */
			prefixes_use_segment(INST_PRE_SS, ps, ci->dt, di);
		}
		else {
			/* Ignore default DS segment. */
			prefixes_use_segment(INST_PRE_DS, ps, ci->dt, di);
		}
	}

	return TRUE;
}